

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O1

HighsDebugStatus __thiscall HEkk::debugNonbasicFlagConsistent(HEkk *this)

{
  HighsOptions *pHVar1;
  HighsDebugStatus HVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  pHVar1 = this->options_;
  if ((pHVar1->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar2 = kNotChecked;
  }
  else {
    uVar5 = (this->lp_).num_row_ + (this->lp_).num_col_;
    uVar3 = 0;
    HVar2 = kOk;
    if (uVar5 != *(int *)&(this->basis_).nonbasicFlag_.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this->basis_).nonbasicFlag_.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start) {
      highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,"nonbasicFlag size error\n"
                 );
      HVar2 = kLogicalError;
    }
    if (0 < (int)uVar5) {
      uVar4 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 + ((this->basis_).nonbasicFlag_.
                         super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4] == '\0');
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    if (uVar3 != (this->lp_).num_row_) {
      highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag has %d, not %d basic variables\n",(ulong)uVar3);
      HVar2 = kLogicalError;
    }
  }
  return HVar2;
}

Assistant:

HighsDebugStatus HEkk::debugNonbasicFlagConsistent() const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;
  HighsInt numTot = lp.num_col_ + lp.num_row_;
  const bool right_size = (HighsInt)basis.nonbasicFlag_.size() == numTot;
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  HighsInt num_basic_variables = 0;
  for (HighsInt var = 0; var < numTot; var++) {
    if (basis.nonbasicFlag_[var] == kNonbasicFlagFalse) {
      num_basic_variables++;
    } else {
      assert(basis.nonbasicFlag_[var] == kNonbasicFlagTrue);
    }
  }
  bool right_num_basic_variables = num_basic_variables == lp.num_row_;
  if (!right_num_basic_variables) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag has %" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT
                " basic variables\n",
                num_basic_variables, lp.num_row_);
    assert(right_num_basic_variables);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}